

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.h
# Opt level: O2

void Js::CompoundString::AppendGeneric<Js::CompoundString>
               (JavascriptString *s,CompoundString *toString,bool appendChars)

{
  char16 c;
  code *pcVar1;
  bool bVar2;
  charcount_t appendCharLength;
  undefined4 *puVar3;
  char16 *pcVar4;
  char16_t *pcVar5;
  char16_t *pcVar6;
  
  if (s == (JavascriptString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x3ec,"(s)","s");
    if (!bVar2) goto LAB_00a0a994;
    *puVar3 = 0;
  }
  if (toString == (CompoundString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x3ed,"(toString)","toString");
    if (!bVar2) goto LAB_00a0a994;
    *puVar3 = 0;
  }
  bVar2 = JavascriptString::IsFinalized((JavascriptString *)toString);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x3ee,"(!toString->IsFinalized())","!toString->IsFinalized()");
    if (!bVar2) goto LAB_00a0a994;
    *puVar3 = 0;
  }
  if (toString->ownsLastBlock == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x3ef,"(toString->OwnsLastBlock())","toString->OwnsLastBlock()");
    if (!bVar2) goto LAB_00a0a994;
    *puVar3 = 0;
  }
  if ((appendChars) && (toString->directCharLength != 0xffffffff)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x3f0,"(!(appendChars && !toString->HasOnlyDirectChars()))",
                                "!(appendChars && !toString->HasOnlyDirectChars())");
    if (!bVar2) {
LAB_00a0a994:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  appendCharLength = JavascriptString::GetLength(s);
  if (appendCharLength == 0) {
    return;
  }
  bVar2 = Phases::IsEnabled((Phases *)&DAT_01453738,StringConcatPhase);
  if (bVar2) {
    bVar2 = JavascriptString::IsFinalized(s);
    pcVar6 = L"";
    pcVar4 = L"";
    if (bVar2) {
      pcVar4 = JavascriptString::GetString(s);
    }
    bVar2 = JavascriptString::IsFinalized(s);
    if (!bVar2) {
      pcVar6 = L"...";
    }
    if (8 < appendCharLength) {
      pcVar6 = L"...";
    }
    pcVar5 = L"false";
    if (appendChars) {
      pcVar5 = L"true";
    }
    Output::Print(L"CompoundString::AppendGeneric(JavascriptString *s = \"%.8s%s\", appendCharLength = %u, appendChars = %s)\n"
                  ,pcVar4,pcVar6,(ulong)appendCharLength,pcVar5);
    Output::Flush();
  }
  if (appendChars) {
    if (appendCharLength != 1) {
LAB_00a0a8b8:
      pcVar4 = GetAppendStringBuffer(toString,s);
      if (appendChars) {
        bVar2 = TryAppendGeneric<Js::CompoundString>(pcVar4,appendCharLength,toString);
      }
      else {
        bVar2 = TryAppendFewCharsGeneric<Js::CompoundString>(pcVar4,appendCharLength,toString);
      }
      if (bVar2 != false) {
        return;
      }
      AppendSlow(toString,pcVar4,appendCharLength);
      return;
    }
LAB_00a0a912:
    pcVar4 = GetAppendStringBuffer(toString,s);
    c = *pcVar4;
    bVar2 = TryAppendGeneric<Js::CompoundString>(c,toString);
    if (!bVar2) {
      AppendSlow(toString,c);
      return;
    }
  }
  else {
    if (toString->directCharLength == 0xffffffff) {
      if (appendCharLength == 1) goto LAB_00a0a912;
      if (appendCharLength < 9) goto LAB_00a0a8b8;
      SwitchToPointerMode(toString);
    }
    bVar2 = TryAppendGeneric<Js::CompoundString>(s,appendCharLength,toString);
    if (!bVar2) {
      AppendSlow(toString,s);
      return;
    }
  }
  return;
}

Assistant:

inline void CompoundString::AppendGeneric(
        JavascriptString *const s,
        String *const toString,
        const bool appendChars)
    {
        Assert(s);
        Assert(toString);
        Assert(!toString->IsFinalized());
        Assert(toString->OwnsLastBlock());
        Assert(!(appendChars && !toString->HasOnlyDirectChars()));

        const CharCount appendCharLength = s->GetLength();
        if(appendCharLength == 0)
            return;

        if(PHASE_TRACE_StringConcat)
        {
            Output::Print(
                _u("CompoundString::AppendGeneric(JavascriptString *s = \"%.8s%s\", appendCharLength = %u, appendChars = %s)\n"),
                s->IsFinalized() ? s->GetString() : _u(""),
                !s->IsFinalized() || appendCharLength > 8 ? _u("...") : _u(""),
                appendCharLength,
                appendChars ? _u("true") : _u("false"));
            Output::Flush();
        }

        if(appendChars || toString->HasOnlyDirectChars())
        {
            if(appendCharLength == 1)
            {
                const char16 c = toString->GetAppendStringBuffer(s)[0];
                if(TryAppendGeneric(c, toString))
                    return;
                toString->AppendSlow(c);
                return;
            }

            if(appendChars || Block::ShouldAppendChars(appendCharLength))
            {
                const char16 *const appendBuffer = toString->GetAppendStringBuffer(s);
                if(appendChars
                        ? TryAppendGeneric(appendBuffer, appendCharLength, toString)
                        : TryAppendFewCharsGeneric(appendBuffer, appendCharLength, toString))
                {
                    return;
                }
                toString->AppendSlow(appendBuffer, appendCharLength);
                return;
            }

            toString->SwitchToPointerMode();
        }

        if(TryAppendGeneric(s, appendCharLength, toString))
            return;
        toString->AppendSlow(s);
    }